

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_affect(AFFECT_DATA *af)

{
  AFFECT_DATA *in_RDI;
  
  if ((in_RDI != (AFFECT_DATA *)0x0) && ((in_RDI->valid & 1U) != 0)) {
    free_pstring((char *)af);
    in_RDI->valid = false;
    in_RDI->next = affect_free;
    affect_free = in_RDI;
  }
  return;
}

Assistant:

void free_affect(AFFECT_DATA *af)
{
	if (!(af != nullptr && af->valid))
		return;

	free_pstring(af->name);

	af->valid = false;
	af->next = affect_free;
	affect_free = af;
}